

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_try(Parser *parser)

{
  Token *name_00;
  Token *name_01;
  bool bVar1;
  List *list;
  void *pvVar2;
  List *stmts_00;
  Type *type_00;
  VarTerm *expr;
  CatchStmt *data;
  TryStmt *pTVar3;
  void *local_38;
  void *finally;
  Token *type;
  Token *name;
  List *catch;
  List *stmts;
  Parser *parser_local;
  
  expect(parser,TRY);
  expect(parser,OP_FL_BRA);
  list = new_list();
  while (parser->token->kind != CL_FL_BRA) {
    pvVar2 = parse_stmt(parser);
    list_add(list,pvVar2);
    move(parser);
  }
  expect(parser,CL_FL_BRA);
  stmts_00 = new_list();
  while (parser->token->kind == CATCH) {
    expect(parser,CATCH);
    name_00 = parser->token;
    expect(parser,ID);
    expect(parser,COLON);
    name_01 = parser->token;
    bVar1 = is_basic_type(parser->token);
    if (bVar1 == 0) {
      expect(parser,ID);
    }
    type_00 = new_type(name_01);
    expr = new_var_term(name_00,(void *)0x0,type_00,(Modifier *)0x0);
    pvVar2 = parse_block(parser);
    data = new_catch_stmt(expr,pvVar2);
    list_add(stmts_00,data);
  }
  local_38 = (void *)0x0;
  if (parser->token->kind == FINALLY) {
    expect(parser,FINALLY);
    local_38 = parse_block(parser);
  }
  pTVar3 = new_try_stmt(list,stmts_00,local_38);
  return pTVar3;
}

Assistant:

void *parse_try(Parser *parser) {
    expect(parser, TRY);
    expect(parser, OP_FL_BRA);
    List *stmts = new_list();
    while (token(parser)->kind != CL_FL_BRA) {
        list_add(stmts, parse_stmt(parser));
        move(parser);
    }
    expect(parser, CL_FL_BRA);
    List *catch = new_list();
    while (token(parser)->kind == CATCH) {
        expect(parser, CATCH);
        Token *name = token(parser);
        expect(parser, ID);
        expect(parser, COLON);
        Token *type = token(parser);
        if (!is_basic_type(token(parser))) {
            expect(parser, ID);
        }
        list_add(catch, new_catch_stmt(new_var_term(name, NULL, new_type(type), NULL),
                                       parse_block(parser)));
    }
    void *finally = NULL;
    if (token(parser)->kind == FINALLY) {
        expect(parser, FINALLY);
        finally = parse_block(parser);
    }
    return new_try_stmt(stmts, catch, finally);
}